

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.h
# Opt level: O3

void __thiscall
DifferenceFormatter::Unser<DataStream,unsigned_short>
          (DifferenceFormatter *this,DataStream *s,unsigned_short *v)

{
  long lVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ReadCompactSize<DataStream>(s,true);
  uVar2 = this->m_shift;
  uVar4 = uVar3 + this->m_shift;
  this->m_shift = uVar4;
  if ((CARRY8(uVar3,uVar2)) || (0xffff < uVar4)) {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"differential value overflow");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    this->m_shift = uVar4 + 1;
    *v = (unsigned_short)uVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        uint64_t n = ReadCompactSize(s);
        m_shift += n;
        if (m_shift < n || m_shift >= std::numeric_limits<uint64_t>::max() || m_shift < std::numeric_limits<I>::min() || m_shift > std::numeric_limits<I>::max()) throw std::ios_base::failure("differential value overflow");
        v = I(m_shift++);
    }